

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcFireSuppressionTerminalType::IfcFireSuppressionTerminalType
          (IfcFireSuppressionTerminalType *this)

{
  *(undefined ***)&this->field_0x1e0 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x1e8 = 0;
  *(char **)&this->field_0x1f0 = "IfcFireSuppressionTerminalType";
  Schema_2x3::IfcFlowTerminalType::IfcFlowTerminalType
            (&this->super_IfcFlowTerminalType,&PTR_construction_vtable_24__0077b918);
  *(undefined8 *)&(this->super_IfcFlowTerminalType).field_0x1b8 = 0;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x77b798;
  *(undefined8 *)&this->field_0x1e0 = 0x77b900;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x77b7c0;
  (this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x77b7e8;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x77b810;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x77b838;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x77b860;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x77b888;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x77b8b0;
  *(undefined8 *)&(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.field_0x1b0
       = 0x77b8d8;
  *(undefined1 **)&(this->super_IfcFlowTerminalType).field_0x1c0 = &this->field_0x1d0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  this->field_0x1d0 = 0;
  return;
}

Assistant:

IfcFireSuppressionTerminalType() : Object("IfcFireSuppressionTerminalType") {}